

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle-allocator.hh
# Opt level: O2

bool __thiscall
tinyusdz::HandleAllocator<unsigned_long>::Has
          (HandleAllocator<unsigned_long> *this,unsigned_long handle)

{
  bool bVar1;
  unsigned_long local_18;
  
  local_18 = handle;
  if (this->dirty_ == true) {
    ::std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    this->dirty_ = false;
  }
  if ((handle != 0) &&
     (bVar1 = ::std::
              binary_search<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(this->freeList_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(this->freeList_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,&local_18), !bVar1)) {
    return local_18 < this->counter_;
  }
  return false;
}

Assistant:

bool Has(const T handle) const {
    if (dirty_) {
      std::sort(freeList_.begin(), freeList_.end());
      dirty_ = false;
    }

    if (handle < 1) {
      return false;
    }

    // Do binary search.
    if (std::binary_search(freeList_.begin(), freeList_.end(), handle)) {
      return false;
    }

    if (handle >= counter_) {
      return false;
    }

    return true;
  }